

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O2

string * __thiscall
tinyusdz::usda::USDAReader::get_warning_abi_cxx11_(string *__return_storage_ptr__,USDAReader *this)

{
  ::std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->_impl->_warn);
  return __return_storage_ptr__;
}

Assistant:

std::string USDAReader::get_warning() { return _impl->GetWarning(); }